

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.h
# Opt level: O2

void __thiscall
CommandLine::addOption<bool&,char,char_const(&)[5],char_const(&)[16]>
          (CommandLine *this,bool *args,char *args_1,char (*args_2) [5],char (*args_3) [16])

{
  CommandLineOption *this_00;
  CommandLineOption *local_38;
  
  this_00 = (CommandLineOption *)operator_new(0x60);
  CommandLineOption::CommandLineOption<bool>(this_00,args,*args_1,*args_2,*args_3);
  local_38 = this_00;
  List<CommandLineOption_*>::append(&this->_options,&local_38);
  return;
}

Assistant:

void addOption (Args&&... args)
	{
		_options << new CommandLineOption (args...);
	}